

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getToken(uchar **pz)

{
  int iVar1;
  long *in_RDI;
  long in_FS_OFFSET;
  uchar *z;
  int t;
  undefined8 local_20;
  undefined4 in_stack_fffffffffffffff0;
  int iToken;
  uchar *z_00;
  
  z_00 = *(uchar **)(in_FS_OFFSET + 0x28);
  local_20 = *in_RDI;
  iToken = -0x55555556;
  do {
    iVar1 = sqlite3GetToken(z_00,(int *)CONCAT44(iToken,in_stack_fffffffffffffff0));
    local_20 = local_20 + iVar1;
  } while (iToken == 0xb8);
  if ((((iToken != 0x3c) && (iToken != 0x76)) && (iToken != 0x77)) &&
     ((iToken != 0xa5 && (iToken != 0xa6)))) {
    iVar1 = sqlite3ParserFallback(iToken);
    if (iVar1 != 0x3c) goto LAB_001a5fd6;
  }
  iToken = 0x3c;
LAB_001a5fd6:
  *in_RDI = local_20;
  if (*(uchar **)(in_FS_OFFSET + 0x28) == z_00) {
    return iToken;
  }
  __stack_chk_fail();
}

Assistant:

static int getToken(const unsigned char **pz){
  const unsigned char *z = *pz;
  int t;                          /* Token type to return */
  do {
    z += sqlite3GetToken(z, &t);
  }while( t==TK_SPACE );
  if( t==TK_ID
   || t==TK_STRING
   || t==TK_JOIN_KW
   || t==TK_WINDOW
   || t==TK_OVER
   || sqlite3ParserFallback(t)==TK_ID
  ){
    t = TK_ID;
  }
  *pz = z;
  return t;
}